

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int rebuild_ch_inner(ptls_buffer_t *buf,uint8_t *src,uint8_t *end,st_ptls_client_hello_t *outer_ch,
                    uint8_t *outer_ext,uint8_t *outer_ext_end)

{
  long lVar1;
  ulong uVar2;
  st_ptls_client_hello_t *psVar3;
  uint8_t *puVar4;
  size_t body_size;
  size_t body_size_3;
  size_t body_start_3;
  size_t capacity_3;
  uint8_t *end_3;
  uint8_t *_src_2;
  uint64_t _block_size64_2;
  size_t _block_size_2;
  size_t _capacity_2;
  size_t body_size_2;
  size_t body_start_2;
  size_t capacity_2;
  uint8_t *end_2;
  uint8_t *_src_1;
  uint64_t _block_size64_1;
  size_t _block_size_1;
  size_t _capacity_1;
  size_t body_size_1;
  size_t body_start_1;
  size_t capacity_1;
  uint8_t *end_1;
  uint8_t *_src;
  uint64_t _block_size64;
  size_t _block_size;
  size_t _capacity;
  uint16_t _v;
  long lStack_70;
  uint16_t legacy_version;
  size_t body_start;
  size_t capacity;
  size_t local_58;
  size_t mess_start;
  ptls_key_schedule_t *_key_sched;
  ptls_buffer_t *_buf;
  uint8_t *puStack_38;
  int ret;
  uint8_t *outer_ext_end_local;
  uint8_t *outer_ext_local;
  st_ptls_client_hello_t *outer_ch_local;
  uint8_t *end_local;
  uint8_t *src_local;
  ptls_buffer_t *buf_local;
  
  mess_start = 0;
  local_58 = buf->off;
  capacity._7_1_ = 1;
  _key_sched = (ptls_key_schedule_t *)buf;
  puStack_38 = outer_ext_end;
  outer_ext_end_local = outer_ext;
  outer_ext_local = (uint8_t *)outer_ch;
  outer_ch_local = (st_ptls_client_hello_t *)end;
  end_local = src;
  src_local = (uint8_t *)buf;
  _buf._4_4_ = ptls_buffer__do_pushv(buf,(void *)((long)&capacity + 7),1);
  if (_buf._4_4_ == 0) {
    body_start = 3;
    _buf._4_4_ = ptls_buffer__do_pushv((ptls_buffer_t *)_key_sched,"",3);
    if (_buf._4_4_ == 0) {
      lStack_70 = *(long *)(_key_sched->secret + 0xc);
      _buf._4_4_ = ptls_decode16((uint16_t *)((long)&_capacity + 6),&end_local,
                                 (uint8_t *)outer_ch_local);
      if (_buf._4_4_ == 0) {
        _capacity._4_2_ = _capacity._6_2_;
        _capacity._2_1_ = (undefined1)((ushort)_capacity._6_2_ >> 8);
        _capacity._3_1_ = (undefined1)_capacity._6_2_;
        _buf._4_4_ = ptls_buffer__do_pushv
                               ((ptls_buffer_t *)src_local,(void *)((long)&_capacity + 2),2);
        if (_buf._4_4_ == 0) {
          if ((long)outer_ch_local - (long)end_local < 0x20) {
            _buf._4_4_ = 0x32;
          }
          else {
            _buf._4_4_ = ptls_buffer__do_pushv((ptls_buffer_t *)src_local,end_local,0x20);
            if (_buf._4_4_ == 0) {
              _block_size = 1;
              if (outer_ch_local == (st_ptls_client_hello_t *)(end_local + 0x20)) {
                _buf._4_4_ = 0x32;
              }
              else {
                _block_size64 = 0;
                end_local = end_local + 0x20;
                do {
                  puVar4 = end_local + 1;
                  _block_size64 = _block_size64 << 8 | (ulong)*end_local;
                  _block_size = _block_size - 1;
                  end_local = puVar4;
                } while (_block_size != 0);
                if ((ulong)((long)outer_ch_local - (long)puVar4) < _block_size64) {
                  _buf._4_4_ = 0x32;
                }
                else if (puVar4 == puVar4 + _block_size64) {
                  if (puVar4 == puVar4 + _block_size64) {
                    body_start_1 = 1;
                    _buf._4_4_ = ptls_buffer__do_pushv((ptls_buffer_t *)src_local,"",1);
                    if (_buf._4_4_ == 0) {
                      lVar1 = *(long *)(src_local + 0x10);
                      _buf._4_4_ = ptls_buffer__do_pushv
                                             ((ptls_buffer_t *)src_local,
                                              *(void **)(outer_ext_local + 0x10),
                                              *(size_t *)(outer_ext_local + 0x18));
                      if (_buf._4_4_ == 0) {
                        uVar2 = *(long *)(src_local + 0x10) - lVar1;
                        if (uVar2 < 0x100) {
                          for (; body_start_1 != 0; body_start_1 = body_start_1 - 1) {
                            *(char *)(*(long *)src_local + (lVar1 - body_start_1)) =
                                 (char)(uVar2 >> (((char)body_start_1 + -1) * '\b' & 0x3fU));
                          }
                          _block_size_1 = 2;
                          if ((ulong)((long)outer_ch_local - (long)end_local) < 2) {
                            _buf._4_4_ = 0x32;
                          }
                          else {
                            _block_size64_1 = 0;
                            do {
                              puVar4 = end_local + 1;
                              _block_size64_1 = _block_size64_1 << 8 | (ulong)*end_local;
                              _block_size_1 = _block_size_1 - 1;
                              end_local = puVar4;
                            } while (_block_size_1 != 0);
                            _buf._4_4_ = 0;
                            if ((ulong)((long)outer_ch_local - (long)puVar4) < _block_size64_1) {
                              _buf._4_4_ = 0x32;
                            }
                            else {
                              psVar3 = (st_ptls_client_hello_t *)(puVar4 + _block_size64_1);
                              body_start_2 = 2;
                              _buf._4_4_ = ptls_buffer__do_pushv((ptls_buffer_t *)src_local,"",2);
                              if (_buf._4_4_ == 0) {
                                lVar1 = *(long *)(src_local + 0x10);
                                _buf._4_4_ = ptls_buffer__do_pushv
                                                       ((ptls_buffer_t *)src_local,end_local,
                                                        (long)psVar3 - (long)end_local);
                                if (_buf._4_4_ == 0) {
                                  uVar2 = *(long *)(src_local + 0x10) - lVar1;
                                  if (uVar2 < 0x10000) {
                                    for (; body_start_2 != 0; body_start_2 = body_start_2 - 1) {
                                      *(char *)(*(long *)src_local + (lVar1 - body_start_2)) =
                                           (char)(uVar2 >> (((char)body_start_2 + -1) * '\b' & 0x3fU
                                                           ));
                                    }
                                    _block_size_2 = 1;
                                    if (outer_ch_local == psVar3) {
                                      _buf._4_4_ = 0x32;
                                    }
                                    else {
                                      _block_size64_2 = 0;
                                      end_local = (uint8_t *)psVar3;
                                      do {
                                        puVar4 = end_local + 1;
                                        _block_size64_2 = _block_size64_2 << 8 | (ulong)*end_local;
                                        _block_size_2 = _block_size_2 - 1;
                                        end_local = puVar4;
                                      } while (_block_size_2 != 0);
                                      _buf._4_4_ = 0;
                                      if ((ulong)((long)outer_ch_local - (long)puVar4) <
                                          _block_size64_2) {
                                        _buf._4_4_ = 0x32;
                                      }
                                      else {
                                        body_start_3 = 1;
                                        _buf._4_4_ = ptls_buffer__do_pushv
                                                               ((ptls_buffer_t *)src_local,"",1);
                                        if (_buf._4_4_ == 0) {
                                          lVar1 = *(long *)(src_local + 0x10);
                                          _buf._4_4_ = ptls_buffer__do_pushv
                                                                 ((ptls_buffer_t *)src_local,
                                                                  end_local,
                                                                  (long)(puVar4 + _block_size64_2) -
                                                                  (long)end_local);
                                          if (_buf._4_4_ == 0) {
                                            uVar2 = *(long *)(src_local + 0x10) - lVar1;
                                            if (uVar2 < 0x100) {
                                              for (; body_start_3 != 0;
                                                  body_start_3 = body_start_3 - 1) {
                                                *(char *)(*(long *)src_local +
                                                         (lVar1 - body_start_3)) =
                                                     (char)(uVar2 >> (((char)body_start_3 + -1) *
                                                                      '\b' & 0x3fU));
                                              }
                                              end_local = puVar4 + _block_size64_2;
                                              _buf._4_4_ = rebuild_ch_inner_extensions
                                                                     ((ptls_buffer_t *)src_local,
                                                                      &end_local,
                                                                      (uint8_t *)outer_ch_local,
                                                                      outer_ext_end_local,puStack_38
                                                                     );
                                              if (_buf._4_4_ == 0) {
                                                uVar2 = *(long *)(_key_sched->secret + 0xc) -
                                                        lStack_70;
                                                if (body_start == 0xffffffffffffffff) {
                                                  _buf._4_4_ = ptls_buffer__adjust_quic_blocksize
                                                                         ((ptls_buffer_t *)
                                                                          _key_sched,uVar2);
                                                  if (_buf._4_4_ != 0) {
                                                    return _buf._4_4_;
                                                  }
                                                }
                                                else {
                                                  if ((body_start < 8) &&
                                                     ((ulong)(1L << ((byte)(body_start << 3) & 0x3f)
                                                             ) <= uVar2)) {
                                                    return 0x20c;
                                                  }
                                                  for (; body_start != 0;
                                                      body_start = body_start - 1) {
                                                    *(char *)(*(long *)_key_sched +
                                                             (lStack_70 - body_start)) =
                                                         (char)(uVar2 >> (((char)body_start + -1) *
                                                                          '\b' & 0x3fU));
                                                  }
                                                }
                                                if (mess_start != 0) {
                                                  ptls__key_schedule_update_hash
                                                            ((ptls_key_schedule_t *)mess_start,
                                                             (uint8_t *)
                                                             (*(long *)_key_sched + local_58),
                                                             *(long *)(_key_sched->secret + 0xc) -
                                                             local_58,0);
                                                }
                                                for (; (st_ptls_client_hello_t *)end_local !=
                                                       outer_ch_local; end_local = end_local + 1) {
                                                  if (*end_local != '\0') {
                                                    return 0x2f;
                                                  }
                                                }
                                              }
                                            }
                                            else {
                                              _buf._4_4_ = 0x20c;
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                  else {
                                    _buf._4_4_ = 0x20c;
                                  }
                                }
                              }
                            }
                          }
                        }
                        else {
                          _buf._4_4_ = 0x20c;
                        }
                      }
                    }
                  }
                  else {
                    _buf._4_4_ = 0x32;
                  }
                }
                else {
                  _buf._4_4_ = 0x2f;
                }
              }
            }
          }
        }
      }
    }
  }
  return _buf._4_4_;
}

Assistant:

static int rebuild_ch_inner(ptls_buffer_t *buf, const uint8_t *src, const uint8_t *const end,
                            struct st_ptls_client_hello_t *outer_ch, const uint8_t *outer_ext, const uint8_t *outer_ext_end)
{
#define COPY_BLOCK(capacity)                                                                                                       \
    do {                                                                                                                           \
        ptls_decode_open_block(src, end, (capacity), {                                                                             \
            ptls_buffer_push_block(buf, (capacity), { ptls_buffer_pushv(buf, src, end - src); });                                  \
            src = end;                                                                                                             \
        });                                                                                                                        \
    } while (0)

    int ret;

    ptls_buffer_push_message_body(buf, NULL, PTLS_HANDSHAKE_TYPE_CLIENT_HELLO, {
        { /* legacy_version */
            uint16_t legacy_version;
            if ((ret = ptls_decode16(&legacy_version, &src, end)) != 0)
                goto Exit;
            ptls_buffer_push16(buf, legacy_version);
        }

        /* hello random */
        if (end - src < PTLS_HELLO_RANDOM_SIZE) {
            ret = PTLS_ALERT_DECODE_ERROR;
            goto Exit;
        }
        ptls_buffer_pushv(buf, src, PTLS_HELLO_RANDOM_SIZE);
        src += PTLS_HELLO_RANDOM_SIZE;

        ptls_decode_open_block(src, end, 1, {
            if (src != end) {
                ret = PTLS_ALERT_ILLEGAL_PARAMETER;
                goto Exit;
            }
        });
        ptls_buffer_push_block(buf, 1,
                               { ptls_buffer_pushv(buf, outer_ch->legacy_session_id.base, outer_ch->legacy_session_id.len); });

        /* cipher-suites and legacy-compression-methods */
        COPY_BLOCK(2);
        COPY_BLOCK(1);

        /* extensions */
        if ((ret = rebuild_ch_inner_extensions(buf, &src, end, outer_ext, outer_ext_end)) != 0)
            goto Exit;
    });

    /* padding must be all zero */
    for (; src != end; ++src) {
        if (*src != '\0') {
            ret = PTLS_ALERT_ILLEGAL_PARAMETER;
            goto Exit;
        }
    }

Exit:
    return ret;

#undef COPY_BLOCK
}